

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_97(QPDF *pdf,char *arg2)

{
  char cVar1;
  __type_conflict1 _Var2;
  int iVar3;
  QPDFObjectHandle nulls2;
  QPDFObjectHandle nulls;
  allocator<char> local_69 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Nulls",local_69);
  QPDFObjectHandle::getKey((string *)&local_28);
  QPDFObjectHandle::getArrayItem((int)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_28._M_string_length);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 != '\0') {
    iVar3 = QPDFObjectHandle::getArrayNItems();
    if (10000 < iVar3) {
      QPDFObjectHandle::shallowCopy();
      QPDFObjectHandle::unparse_abi_cxx11_();
      QPDFObjectHandle::unparse_abi_cxx11_();
      _Var2 = std::operator==(&local_48,&local_28);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&local_28);
        std::__cxx11::string::~string((string *)&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        return;
      }
      __assert_fail("nulls.unparse() == nulls2.unparse()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0xd70,"void test_97(QPDF &, const char *)");
    }
  }
  __assert_fail("nulls.isArray() && nulls.getArrayNItems() > 10000",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0xd6e,"void test_97(QPDF &, const char *)");
}

Assistant:

static void
test_97(QPDF& pdf, char const* arg2)
{
    // Shallow array copy. This test uses many-nulls.pdf.
    auto nulls = pdf.getTrailer().getKey("/Nulls").getArrayItem(0);
    assert(nulls.isArray() && nulls.getArrayNItems() > 10000);
    auto nulls2 = nulls.shallowCopy();
    assert(nulls.unparse() == nulls2.unparse());
}